

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# visualinfo.c
# Opt level: O0

GLboolean ParseArgs(int argc,char **argv)

{
  int iVar1;
  long lVar2;
  int local_1c;
  int p;
  char **argv_local;
  int argc_local;
  
  local_1c = 0;
  do {
    if (argc <= local_1c) {
      return '\0';
    }
    iVar1 = strcmp(argv[local_1c],"-display");
    if (iVar1 == 0) {
      if (argc <= local_1c + 1) {
        return '\x01';
      }
      display = argv[local_1c + 1];
    }
    else {
      iVar1 = strcmp(argv[local_1c],"-visual");
      if (iVar1 != 0) {
        iVar1 = strcmp(argv[local_1c],"-h");
        if (iVar1 == 0) {
          return '\x01';
        }
        return '\x01';
      }
      if (argc <= local_1c + 1) {
        return '\x01';
      }
      lVar2 = strtol(argv[local_1c + 1],(char **)0x0,0);
      visual = (int)lVar2;
    }
    local_1c = local_1c + 2;
  } while( true );
}

Assistant:

GLboolean ParseArgs (int argc, char** argv)
{
  int p = 0;
  while (p < argc)
  {
#if defined(_WIN32)
    if (!strcmp(argv[p], "-pf") || !strcmp(argv[p], "-pixelformat"))
    {
      if (++p >= argc) return GL_TRUE;
      display = NULL;
      visual = strtol(argv[p], NULL, 0);
    }
    else if (!strcmp(argv[p], "-a"))
    {
      showall = 1;
    }
    else if (!strcmp(argv[p], "-s"))
    {
      displaystdout = 1;
    }
    else if (!strcmp(argv[p], "-h"))
    {
      return GL_TRUE;
    }
    else
      return GL_TRUE;
#else
    if (!strcmp(argv[p], "-display"))
    {
      if (++p >= argc) return GL_TRUE;
      display = argv[p];
    }
    else if (!strcmp(argv[p], "-visual"))
    {
      if (++p >= argc) return GL_TRUE;
      visual = (int)strtol(argv[p], NULL, 0);
    }
    else if (!strcmp(argv[p], "-h"))
    {
      return GL_TRUE;
    }
    else
      return GL_TRUE;
#endif
    p++;
  }
  return GL_FALSE;
}